

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::anon_unknown_2::GenerateCEnum
               (EnumDescriptor *desc,Printer *printer)

{
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *this;
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  FileDescriptor *this_00;
  FileDescriptor *file;
  size_type in_R9;
  string_view s;
  string_view sVar4;
  FixedMapping replacements;
  FixedMapping replacements_00;
  string_view local_1d8;
  string local_1c8;
  string_view local_1a8;
  string_view local_198;
  EnumValueDescriptor *local_188;
  EnumValueDescriptor *value;
  undefined1 local_178 [4];
  int i;
  string_view local_158;
  string_view local_148;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_138;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_118;
  undefined8 local_110;
  Options local_f8;
  string local_c8;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  string php_name;
  lts_20250127 *local_48;
  char *local_40;
  undefined1 local_38 [8];
  string c_name;
  Printer *printer_local;
  EnumDescriptor *desc_local;
  
  c_name.field_2._8_8_ = printer;
  sVar4 = EnumDescriptor::full_name(desc);
  this = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          *)((long)&php_name.field_2 + 8);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (this,(char (*) [2])0x2073f9e,(char (*) [2])0x1cf2682);
  local_48 = (lts_20250127 *)sVar4._M_len;
  local_40 = sVar4._M_str;
  sVar4._M_str = (char *)this;
  sVar4._M_len = (size_t)local_40;
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_((string *)local_38,local_48,sVar4,replacements);
  local_f8.aggregate_metadata_prefixes.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_f8.aggregate_metadata_prefixes.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = (ctrl_t *)0x0;
  local_f8.is_descriptor = false;
  local_f8.aggregate_metadata = false;
  local_f8.gen_c_wkt = false;
  local_f8._3_5_ = 0;
  local_f8.aggregate_metadata_prefixes.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_f8.aggregate_metadata_prefixes.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)0x0;
  Options::Options(&local_f8);
  FullClassName<google::protobuf::EnumDescriptor>(&local_c8,desc,&local_f8);
  local_a8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c8);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_138,(char (*) [2])0x2122162,(char (*) [3])"\\\\");
  local_118 = &local_138;
  local_110 = 1;
  s._M_str = (char *)local_118;
  s._M_len = local_a8._8_8_;
  replacements_00._M_len = in_R9;
  replacements_00._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_
            ((string *)local_98,(lts_20250127 *)local_a8._0_8_,s,replacements_00);
  std::__cxx11::string::~string((string *)&local_c8);
  Options::~Options(&local_f8);
  uVar1 = c_name.field_2._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_148,
             "/* $c_name$ */\n\nzend_class_entry* $c_name$_ce;\n\nPHP_METHOD($c_name$, name) {\n  $file_c_name$_AddDescriptor();\n  const upb_DefPool *symtab = DescriptorPool_GetSymbolTable();\n  const upb_EnumDef *e = upb_DefPool_FindEnumByName(symtab, \"$name$\");\n  zend_long value;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"l\", &value) ==\n      FAILURE) {\n    return;\n  }\n  const upb_EnumValueDef* ev =\n      upb_EnumDef_FindValueByNumber(e, value);\n  if (!ev) {\n    zend_throw_exception_ex(NULL, 0,\n                            \"$php_name$ has no name \"\n                            \"defined for value \" ZEND_LONG_FMT \".\",\n                            value);\n    return;\n  }\n  RETURN_STRING(upb_EnumValueDef_Name(ev));\n}\n\nPHP_METHOD($c_name$, value) {\n  $file_c_name$_AddDescriptor();\n  const upb_DefPool *symtab = DescriptorPool_GetSymbolTable();\n  const upb_EnumDef *e = upb_DefPool_FindEnumByName(symtab, \"$name$\");\n  char *name = NULL;\n  size_t name_len;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"s\", &name,\n                            &name_len) == FAILURE) {\n    return;\n  }\n  const upb_EnumValueDef* ev = upb_EnumDef_FindValueByNameWithSize(\n      e, name, name_len);\n  if (!ev) {\n    zend_throw_exception_ex(NULL, 0,\n                            \"$php_name$ has no value \"\n                            \"defined for name %s.\",\n                            name);\n    return;\n  }\n  RETURN_LONG(upb_EnumValueDef_Number(ev));\n}\n\nstatic zend_function_entry $c_name$_phpmethods[] = {\n  PHP_ME($c_name$, name, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n  PHP_ME($c_name$, value, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n  ZEND_FE_END\n};\n\nstatic void $c_name$_ModuleInit() {\n  zend_class_entry tmp_ce;\n\n  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n                   $c_name$_phpmethods);\n\n  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n"
            );
  local_158 = EnumDescriptor::full_name(desc);
  this_00 = EnumDescriptor::file(desc);
  php::(anonymous_namespace)::FilenameCName_abi_cxx11_
            ((string *)local_178,(_anonymous_namespace_ *)this_00,file);
  protobuf::io::Printer::
  Print<char[5],std::basic_string_view<char,std::char_traits<char>>,char[12],std::__cxx11::string,char[7],std::__cxx11::string,char[9],std::__cxx11::string>
            ((Printer *)uVar1,local_148,(char (*) [5])0x1d1c66d,&local_158,
             (char (*) [12])"file_c_name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
             (char (*) [7])0x1fb8d76,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (char (*) [9])"php_name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  std::__cxx11::string::~string((string *)local_178);
  value._4_4_ = 0;
  while( true ) {
    iVar3 = value._4_4_;
    iVar2 = EnumDescriptor::value_count(desc);
    uVar1 = c_name.field_2._8_8_;
    if (iVar2 <= iVar3) break;
    local_188 = EnumDescriptor::value(desc,value._4_4_);
    uVar1 = c_name.field_2._8_8_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_198,
               "  zend_declare_class_constant_long($c_name$_ce, \"$name$\",\n                                   strlen(\"$name$\"), $num$);\n"
              );
    local_1a8 = EnumValueDescriptor::name(local_188);
    iVar3 = EnumValueDescriptor::number(local_188);
    std::__cxx11::to_string(&local_1c8,iVar3);
    protobuf::io::Printer::
    Print<char[7],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>,char[4],std::__cxx11::string>
              ((Printer *)uVar1,local_198,(char (*) [7])0x1fb8d76,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (char (*) [5])0x1d1c66d,&local_1a8,(char (*) [4])0x1dde84d,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    value._4_4_ = value._4_4_ + 1;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"}\n\n");
  protobuf::io::Printer::Print<>((Printer *)uVar1,local_1d8);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void GenerateCEnum(const EnumDescriptor* desc, io::Printer* printer) {
  std::string c_name = absl::StrReplaceAll(desc->full_name(), {{".", "_"}});
  std::string php_name =
      absl::StrReplaceAll(FullClassName(desc, Options()), {{"\\", "\\\\"}});
  printer->Print(
      "/* $c_name$ */\n"
      "\n"
      "zend_class_entry* $c_name$_ce;\n"
      "\n"
      "PHP_METHOD($c_name$, name) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  const upb_DefPool *symtab = DescriptorPool_GetSymbolTable();\n"
      "  const upb_EnumDef *e = upb_DefPool_FindEnumByName(symtab, "
      "\"$name$\");\n"
      "  zend_long value;\n"
      "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"l\", &value) ==\n"
      "      FAILURE) {\n"
      "    return;\n"
      "  }\n"
      "  const upb_EnumValueDef* ev =\n"
      "      upb_EnumDef_FindValueByNumber(e, value);\n"
      "  if (!ev) {\n"
      "    zend_throw_exception_ex(NULL, 0,\n"
      "                            \"$php_name$ has no name \"\n"
      "                            \"defined for value \" ZEND_LONG_FMT "
      "\".\",\n"
      "                            value);\n"
      "    return;\n"
      "  }\n"
      "  RETURN_STRING(upb_EnumValueDef_Name(ev));\n"
      "}\n"
      "\n"
      "PHP_METHOD($c_name$, value) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  const upb_DefPool *symtab = DescriptorPool_GetSymbolTable();\n"
      "  const upb_EnumDef *e = upb_DefPool_FindEnumByName(symtab, "
      "\"$name$\");\n"
      "  char *name = NULL;\n"
      "  size_t name_len;\n"
      "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"s\", &name,\n"
      "                            &name_len) == FAILURE) {\n"
      "    return;\n"
      "  }\n"
      "  const upb_EnumValueDef* ev = upb_EnumDef_FindValueByNameWithSize(\n"
      "      e, name, name_len);\n"
      "  if (!ev) {\n"
      "    zend_throw_exception_ex(NULL, 0,\n"
      "                            \"$php_name$ has no value \"\n"
      "                            \"defined for name %s.\",\n"
      "                            name);\n"
      "    return;\n"
      "  }\n"
      "  RETURN_LONG(upb_EnumValueDef_Number(ev));\n"
      "}\n"
      "\n"
      "static zend_function_entry $c_name$_phpmethods[] = {\n"
      "  PHP_ME($c_name$, name, arginfo_lookup, ZEND_ACC_PUBLIC | "
      "ZEND_ACC_STATIC)\n"
      "  PHP_ME($c_name$, value, arginfo_lookup, ZEND_ACC_PUBLIC | "
      "ZEND_ACC_STATIC)\n"
      "  ZEND_FE_END\n"
      "};\n"
      "\n"
      "static void $c_name$_ModuleInit() {\n"
      "  zend_class_entry tmp_ce;\n"
      "\n"
      "  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n"
      "                   $c_name$_phpmethods);\n"
      "\n"
      "  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n",
      "name", desc->full_name(), "file_c_name", FilenameCName(desc->file()),
      "c_name", c_name, "php_name", php_name);

  for (int i = 0; i < desc->value_count(); i++) {
    const EnumValueDescriptor* value = desc->value(i);
    printer->Print(
        "  zend_declare_class_constant_long($c_name$_ce, \"$name$\",\n"
        "                                   strlen(\"$name$\"), $num$);\n",
        "c_name", c_name, "name", value->name(), "num",
        std::to_string(value->number()));
  }

  printer->Print(
      "}\n"
      "\n");
}